

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O2

void make_terrible(artifact *art,object *obj)

{
  int16_t *piVar1;
  int16_t *piVar2;
  _Bool **pp_Var3;
  _Bool **pp_Var4;
  _Bool **pp_Var5;
  _Bool **pp_Var6;
  undefined2 uVar7;
  undefined2 uVar8;
  byte bVar9;
  int16_t *piVar10;
  int16_t *piVar11;
  int16_t *piVar12;
  int16_t *piVar13;
  obj_property *poVar14;
  _Bool _Var15;
  _Bool _Var16;
  short sVar17;
  int16_t iVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  int iVar22;
  wchar_t wVar23;
  uint uVar24;
  wchar_t wVar25;
  int16_t *bonus;
  object_kind *kind;
  activation **ppaVar26;
  int16_t *piVar27;
  wchar_t *pwVar28;
  short sVar29;
  int16_t *piVar30;
  int16_t *piVar31;
  bitflag *flags;
  int iVar32;
  ulong uVar33;
  _Bool **pp_Var34;
  long lVar35;
  _Bool *p_Var36;
  element_info *peVar37;
  short *psVar38;
  wchar_t pick;
  bool bVar39;
  undefined1 auVar40 [16];
  
  if (art == (artifact *)0x0) {
    wVar23 = (wchar_t)obj->tval;
    wVar25 = (wchar_t)obj->sval;
  }
  else {
    wVar23 = art->tval;
    wVar25 = art->sval;
  }
  kind = lookup_kind(wVar23,wVar25);
  _Var15 = tval_is_melee_weapon_k(kind);
  if (potential < L'ඬ') {
    iVar32 = (L'ஷ' < potential) + 1;
  }
  else {
    uVar19 = Rand_div(3);
    iVar32 = 3 - (uint)(uVar19 == 0);
  }
  if (((art == (artifact *)0x0) || (art->activation == (activation *)0x0)) ||
     (uVar19 = Rand_div(3), uVar19 == 0)) {
    if (((obj == (object *)0x0) || (obj->activation == (activation *)0x0)) ||
       (uVar19 = Rand_div(3), uVar19 == 0)) goto LAB_0018722b;
    ppaVar26 = &obj->activation;
  }
  else {
    ppaVar26 = &art->activation;
  }
  *ppaVar26 = (activation *)0x0;
LAB_0018722b:
  uVar19 = Rand_div(2);
  piVar1 = art->modifiers;
  piVar2 = obj->modifiers;
  pp_Var3 = &art->slays;
  bVar39 = art != (artifact *)0x0;
  piVar10 = obj->modifiers;
  if (bVar39) {
    piVar10 = art->modifiers;
  }
  pp_Var4 = &obj->slays;
  pp_Var5 = &art->brands;
  flags = obj->flags;
  if (bVar39) {
    flags = art->flags;
  }
  pp_Var6 = &obj->brands;
  piVar11 = art->modifiers;
  if (!bVar39) {
    piVar11 = obj->modifiers;
  }
  piVar12 = art->modifiers;
  piVar13 = art->modifiers;
  if (!bVar39) {
    piVar12 = obj->modifiers;
    piVar13 = obj->modifiers;
  }
  uVar33 = 0;
  do {
    if ((int)(uVar19 + 2) <= (int)uVar33) {
      if ((art != (artifact *)0x0) && (art->cost < L'\0')) {
        art->cost = L'\0';
      }
      while (iVar32 != 0) {
        if (art == (artifact *)0x0) {
          pwVar28 = &obj->kind->alloc_min;
          wVar23 = (wchar_t)obj->tval;
        }
        else {
          wVar23 = art->tval;
          pwVar28 = &art->alloc_min;
        }
        wVar25 = *pwVar28;
        uVar19 = Rand_div(z_info->curse_max - 1);
        pick = uVar19 + L'\x01';
        uVar19 = Rand_div(9);
        iVar18 = m_bonus(9,wVar25);
        if (curses[pick].poss[wVar23] == true) {
          wVar23 = uVar19 + iVar18 * 10 + L'\x01';
          if (art == (artifact *)0x0) {
            append_object_curse(obj,pick,wVar23);
          }
          else {
            append_artifact_curse(art,pick,wVar23);
          }
          iVar32 = iVar32 + -1;
        }
      }
      return;
    }
    if (((_Var15) && (_Var16 = has_property(art,obj,"skill bonus"), _Var16)) &&
       (uVar20 = Rand_div(2), uVar20 == 0)) {
LAB_001873d2:
      if (art == (artifact *)0x0) {
        uVar20 = Rand_div(2);
        if (uVar20 == 0) {
          uVar20 = Rand_div(7);
          obj->to_h = (short)uVar20 * -2 + -0xc;
          uVar20 = Rand_div(3);
          if (uVar20 != 0) {
            uVar20 = Rand_div(7);
            sVar29 = (short)uVar20 * -2 + -0xc;
            goto LAB_00187691;
          }
        }
        else {
          sVar17 = obj->to_h;
          if (0 < sVar17) {
            obj->to_h = -sVar17;
            sVar17 = 1;
          }
          sVar29 = obj->to_d;
          if (sVar29 < 1) {
            if ((sVar29 == 0 && sVar17 == 0) && (uVar20 = Rand_div(5), uVar20 == 0)) {
              uVar20 = Rand_div(4);
              uVar7 = obj->to_h;
              uVar8 = obj->to_d;
              auVar40 = ZEXT416(uVar20 * -5 - 10);
              auVar40 = pshuflw(auVar40,auVar40,0);
              obj->to_h = auVar40._0_2_ + uVar7;
              obj->to_d = auVar40._2_2_ + uVar8;
            }
          }
          else {
            sVar29 = -sVar29;
LAB_00187691:
            obj->to_d = sVar29;
          }
        }
      }
      else {
        _Var16 = tval_is_weapon_a(art);
        if (_Var16) {
          uVar20 = Rand_div(7);
          art->to_h = (short)uVar20 * -2 + -0xc;
          uVar20 = Rand_div(3);
          if (uVar20 == 0) {
LAB_001876b1:
            sVar29 = art->to_d;
          }
          else {
            uVar20 = Rand_div(7);
            sVar17 = (short)uVar20 * 2;
            sVar29 = -0xc;
LAB_00187424:
            sVar29 = sVar29 - sVar17;
            art->to_d = sVar29;
          }
          if (sVar29 < 0) goto LAB_001876c9;
          if (art->to_h < 0) goto LAB_001876d1;
          wVar23 = art->cost;
        }
        else {
          sVar29 = art->to_h;
          if (0 < sVar29) {
            art->to_h = -sVar29;
            sVar29 = 1;
          }
          sVar17 = art->to_d;
          if (sVar17 < 1) {
            if (sVar17 == 0) {
              if ((sVar29 != 0) || (uVar20 = Rand_div(5), uVar20 != 0)) goto LAB_001876b1;
              uVar20 = Rand_div(4);
              sVar17 = (short)uVar20 * 5 + 10;
              art->to_h = art->to_h - sVar17;
              sVar29 = art->to_d;
              goto LAB_00187424;
            }
          }
          else {
            art->to_d = -sVar17;
          }
LAB_001876c9:
          if (art->to_h < 0) {
            wVar23 = art->cost;
            iVar22 = -10000;
          }
          else {
LAB_001876d1:
            wVar23 = art->cost;
            iVar22 = -5000;
          }
          wVar23 = wVar23 + iVar22;
          art->cost = wVar23;
        }
        if (wVar23 < L'\0') {
          art->cost = L'\0';
        }
      }
    }
    else {
      _Var16 = has_property(art,obj,"armor bonus");
      if ((!_Var16) || (uVar20 = Rand_div(2), uVar20 != 0)) {
        uVar20 = Rand_div(2);
        if (uVar20 == 0) {
          uVar21 = Rand_div(3);
          if (uVar21 == 0) {
            uVar21 = Rand_div(5);
            sVar29 = -4 - (short)uVar21;
            uVar21 = Rand_div(3);
            for (lVar35 = 0; lVar35 != 0x22; lVar35 = lVar35 + 2) {
              piVar27 = piVar2;
              if (art != (artifact *)0x0) {
                piVar27 = piVar1;
              }
              *(undefined2 *)((long)piVar27 + lVar35) = 0;
            }
            if (uVar21 == 0) {
              sVar29 = sVar29 * 5;
            }
            uVar21 = Rand_div(5);
            if (uVar21 == 0) {
              piVar27 = piVar1;
              piVar30 = piVar2;
              for (lVar35 = 0; lVar35 != 5; lVar35 = lVar35 + 1) {
                if (((uint)lVar35 < 5) && ((0x19U >> ((uint)lVar35 & 0x1f) & 1) != 0)) {
                  piVar31 = piVar30;
                  if (art != (artifact *)0x0) {
                    piVar31 = piVar27;
                  }
                  *piVar31 = sVar29;
                }
                piVar30 = piVar30 + 1;
                piVar27 = piVar27 + 1;
              }
            }
            else {
              uVar21 = Rand_div(4);
              if (uVar21 == 0) {
                uVar24 = 0xffffffff;
                for (lVar35 = 0; lVar35 != 10; lVar35 = lVar35 + 2) {
                  if (uVar24 < 2) {
                    piVar27 = piVar2;
                    if (art != (artifact *)0x0) {
                      piVar27 = piVar1;
                    }
                    *(short *)((long)piVar27 + lVar35) = sVar29;
                  }
                  uVar24 = uVar24 + 1;
                }
              }
              else {
                uVar21 = Rand_div(6);
                if (uVar21 == 0) {
                  piVar10[9] = sVar29;
                }
                else {
                  for (lVar35 = 0; lVar35 != 10; lVar35 = lVar35 + 2) {
                    uVar21 = Rand_div(4);
                    if (uVar21 == 0) {
                      piVar27 = piVar2;
                      if (art != (artifact *)0x0) {
                        piVar27 = piVar1;
                      }
                      *(short *)((long)piVar27 + lVar35) = sVar29;
                    }
                  }
                }
              }
            }
            uVar21 = Rand_div(2);
            iVar32 = iVar32 + uVar21 + 1;
            if (art != (artifact *)0x0) {
              iVar22 = -60000;
              wVar23 = L'\xea60';
              goto LAB_001877f4;
            }
          }
          else {
            for (lVar35 = 0; lVar35 != 10; lVar35 = lVar35 + 2) {
              piVar27 = piVar2;
              if (art != (artifact *)0x0) {
                piVar27 = piVar1;
              }
              if (0 < *(short *)((long)piVar27 + lVar35)) {
                *(short *)((long)piVar27 + lVar35) = -*(short *)((long)piVar27 + lVar35);
              }
            }
            if (art != (artifact *)0x0) {
              iVar22 = -30000;
              wVar23 = L'田';
LAB_001877f4:
              wVar25 = iVar22 + art->cost;
              if (art->cost < wVar23) {
                wVar25 = L'\0';
              }
              art->cost = wVar25;
            }
          }
LAB_00187808:
          if (uVar20 != 1) goto LAB_00187abe;
          piVar11[10] = 0;
          uVar20 = Rand_div(4);
          if (uVar20 == 0) {
            piVar13[0xb] = 0;
          }
          uVar20 = Rand_div(4);
          if (uVar20 == 0) {
            piVar12[0xc] = 0;
          }
          for (uVar33 = 0; bVar9 = z_info->slay_max, uVar33 < bVar9; uVar33 = uVar33 + 1) {
            if (art == (artifact *)0x0) {
              p_Var36 = (_Bool *)0x0;
            }
            else {
              p_Var36 = *pp_Var3 + uVar33;
              if (*pp_Var3 == (_Bool *)0x0) {
                p_Var36 = (_Bool *)0x0;
              }
            }
            if ((obj != (object *)0x0) && (*pp_Var4 != (_Bool *)0x0)) {
              p_Var36 = *pp_Var4 + uVar33;
            }
            uVar20 = Rand_div(3);
            if ((uVar20 == 0) && (p_Var36 != (_Bool *)0x0)) {
              *p_Var36 = false;
            }
          }
          for (uVar33 = 0; (uint)bVar9 != uVar33; uVar33 = uVar33 + 1) {
            if (((art != (artifact *)0x0) && (*pp_Var3 != (_Bool *)0x0)) &&
               ((*pp_Var3)[uVar33] != false)) goto LAB_001878fe;
            if (((obj != (object *)0x0) && (*pp_Var4 != (_Bool *)0x0)) &&
               ((*pp_Var4)[uVar33] != false)) goto LAB_001878f0;
          }
          uVar33 = (ulong)(uint)bVar9;
LAB_001878f0:
          if ((art == (artifact *)0x0) || (pp_Var34 = pp_Var3, (uint)uVar33 != (uint)bVar9)) {
LAB_001878fe:
            if ((obj != (object *)0x0) && (pp_Var34 = pp_Var4, (uint)uVar33 == (uint)bVar9))
            goto LAB_0018790c;
          }
          else {
LAB_0018790c:
            mem_free(*pp_Var34);
            *pp_Var34 = (_Bool *)0x0;
          }
          uVar20 = Rand_div(3);
          if (uVar20 == 0) {
            flag_off(flags,6,0x2a);
          }
          for (uVar33 = 0; bVar9 = z_info->brand_max, uVar33 < bVar9; uVar33 = uVar33 + 1) {
            if (art == (artifact *)0x0) {
              p_Var36 = (_Bool *)0x0;
            }
            else {
              p_Var36 = *pp_Var5 + uVar33;
              if (*pp_Var5 == (_Bool *)0x0) {
                p_Var36 = (_Bool *)0x0;
              }
            }
            if ((obj != (object *)0x0) && (*pp_Var6 != (_Bool *)0x0)) {
              p_Var36 = *pp_Var6 + uVar33;
            }
            uVar20 = Rand_div(3);
            if ((uVar20 == 0) && (p_Var36 != (_Bool *)0x0)) {
              *p_Var36 = false;
            }
          }
          for (uVar33 = 0; (uint)bVar9 != uVar33; uVar33 = uVar33 + 1) {
            if (((art != (artifact *)0x0) && (*pp_Var5 != (_Bool *)0x0)) &&
               ((*pp_Var5)[uVar33] != false)) goto LAB_001879e9;
            if (((obj != (object *)0x0) && (*pp_Var6 != (_Bool *)0x0)) &&
               ((*pp_Var6)[uVar33] != false)) goto LAB_001879db;
          }
          uVar33 = (ulong)(uint)bVar9;
LAB_001879db:
          if ((art == (artifact *)0x0) || (pp_Var34 = pp_Var5, (uint)uVar33 != (uint)bVar9)) {
LAB_001879e9:
            if ((obj != (object *)0x0) && (pp_Var34 = pp_Var6, (uint)uVar33 == (uint)bVar9))
            goto LAB_001879f7;
          }
          else {
LAB_001879f7:
            mem_free(*pp_Var34);
            *pp_Var34 = (_Bool *)0x0;
          }
          for (lVar35 = 0; lVar35 != 0x34; lVar35 = lVar35 + 4) {
            peVar37 = obj->el_info;
            if (art != (artifact *)0x0) {
              peVar37 = art->el_info;
            }
            uVar20 = Rand_div(3);
            if (uVar20 == 0) {
              psVar38 = (short *)((long)&peVar37->res_level + lVar35);
              sVar29 = *psVar38;
              if (sVar29 < 100) {
                *psVar38 = 200 - sVar29;
              }
            }
          }
          lVar35 = 0x14;
          for (uVar33 = 0; poVar14 = obj_properties, uVar33 < z_info->property_max;
              uVar33 = uVar33 + 1) {
            uVar20 = Rand_div(3);
            if (((uVar20 == 0) && (*(int *)((long)poVar14->type_mult + lVar35 + -0x2c) == 3)) &&
               ((*(uint *)((long)poVar14->type_mult + lVar35 + -0x28) & 0xfffffffe) == 2)) {
              flag_off(flags,6,*(int *)((long)poVar14->type_mult + lVar35 + -0x20));
            }
            lVar35 = lVar35 + 0xf0;
          }
          if ((art != (artifact *)0x0) && (L'\0' < art->cost)) {
            art->cost = (uint)art->cost / 3;
          }
          goto LAB_00187abe;
        }
        if (uVar20 == 0xffffffff) goto LAB_001873d2;
        if (uVar20 != 0xfffffffe) goto LAB_00187808;
      }
      if (art == (artifact *)0x0) {
        if ((obj->ac == 0) || (uVar20 = Rand_div(6), uVar20 != 0)) {
          uVar20 = Rand_div(4);
          if (uVar20 == 0) {
            uVar20 = Rand_div(3);
            obj->to_a = (short)uVar20 * -5 + -0xf;
          }
        }
        else {
          obj->ac = 0;
        }
      }
      else {
        if ((art->ac != 0) && (uVar20 = Rand_div(6), uVar20 == 0)) {
          art->cost = art->cost + art->ac * -500;
          art->ac = 0;
        }
        if ((art->tval < L'\n') || (art->to_a < 0)) {
          uVar20 = Rand_div(4);
          if ((uVar20 == 0) && (art->tval < L'\n')) {
            uVar20 = Rand_div(3);
            art->to_a = (short)uVar20 * -5 + -0xf;
            art->cost = uVar20 * -1000 + art->cost + L'\xfffff448';
          }
          sVar29 = art->to_a;
        }
        else {
          uVar20 = Rand_div(7);
          sVar29 = (short)uVar20 * -2 + -0xc;
          art->to_a = sVar29;
        }
        if (sVar29 < 0) {
          art->cost = art->cost + sVar29 * 400;
        }
      }
    }
LAB_00187abe:
    uVar33 = (ulong)((int)uVar33 + 1);
  } while( true );
}

Assistant:

static void make_terrible(struct artifact *art, struct object *obj)
{
	int i, gauntlet_runs;
	int num_curses = 1;
	struct object_kind *kind = art ? lookup_kind(art->tval, art->sval) :
		lookup_kind(obj->tval, obj->sval);
	bool weapon = tval_is_melee_weapon_k(kind);

	/* Determine whether the artifact's magics are perilous enough to warrant
	 * extra curses. */
	if (potential >= 3000) {
		num_curses++;
	}
	if ((potential >= 3500) && !one_in_(3)) {
		num_curses++;
	}

	/* Greatly decrease the chance for an activation. */
	if (art && art->activation && !one_in_(3)) {
		art->activation = NULL;
	} else if (obj && obj->activation && !one_in_(3)) {
		obj->activation = NULL;
	}

	/* Force the artifact though the gauntlet two or three times. */
	gauntlet_runs = 1 + randint1(2);
	for (i = 0; i < gauntlet_runs; i++) {
		int j, wheel_of_doom, penalty = 0;

		/* Choose a curse, biased towards penalties to_a, to_d, and to_h. */
		if (weapon && has_property(art, obj, "skill bonus") && one_in_(2)) {
			wheel_of_doom = 2;
		} else if (has_property(art, obj, "armor bonus") && one_in_(2)) {
			wheel_of_doom = 1;
		} else {
			wheel_of_doom = 2 + randint1(2);
		}
		/* Blast base armour class or inflict a penalty to armour class. */
		if (wheel_of_doom == 1) {

			if (art) {
				/* Blast armour and twist magics. */
				if ((art->ac) && (one_in_(6))) {
					art->cost -= 500L * art->ac;
					art->ac = 0;
				}
				if ((art->tval >= TV_BOOTS) && (art->to_a >= 0)) {
					art->to_a = -(5 + randint1(7)) * 2;
				} else if ((one_in_(4)) && (art->tval < TV_BOOTS)) {
					/* Chance of a truly nasty effect for weapons. */
					penalty = randint1(3) + 2;
					penalty *= 5;
					art->to_a = -penalty;
					art->cost -= penalty * 200L;
				}

				/* Artifact might very well still have some value. */
				if (art->to_a < 0) {
					art->cost += art->to_a * 400L;
				}
			} else {
				/* Invert armour class. */
				if ((obj->ac) && (randint1(6) == 1)) {
					obj->ac = 0;
				} else if (randint1(4) == 1) {
					/* Chance of a truly nasty effect. */
					penalty = randint1(3) + 2;
					penalty *= 5;
					obj->to_a = -penalty;
				}
			}
		}

		/* Make either the Skill or Deadliness bonus negative, or both. */
		if (wheel_of_doom == 2) {

			if (art) {
				/* Weapons. */
				if (tval_is_weapon_a(art)) {
					/* Blast items with bonuses, Deadliness more rarely. */
					art->to_h = -(5 + randint1(7)) * 2;
					if (!one_in_(3)) {
						art->to_d = -(5 + randint1(7)) * 2;
					}
				} else {
					/* All armours. */

					/* Reverse any magics. */
					if (art->to_h > 0) {
						art->to_h = -art->to_h;
					}
					if (art->to_d > 0) {
						art->to_d = -art->to_d;
					}

					/* Sometimes, blast even items without bonuses. */
					if (!art->to_d && !art->to_h && one_in_(5)) {
						penalty = randint1(4) + 1;
						penalty *= 5;
						art->to_h -= penalty;
						art->to_d -= penalty;
					}
				}

				/* Artifact might very well still have some value. */
				if ((art->to_d < 0) && (art->to_h < 0)) {
					art->cost -= 10000L;
				} else if ((art->to_d < 0) || (art->to_h < 0)) {
					art->cost -= 5000L;
				}
				if (art->cost < 0) {
					art->cost = 0;
				}
			} else {
				if (randint1(2) == 1) {
					/* One type of badness... */
					/* Blast items with bonuses, Deadliness more rarely. */
					obj->to_h = -(5 + randint1(7)) * 2;
					if (!one_in_(3)) {
						obj->to_d = -(5 + randint1(7)) * 2;
					}
				} else {
					/* ...or another. */
					/* Reverse any magics. */
					if (obj->to_h > 0) {
						obj->to_h = -obj->to_h;
					}
					if (obj->to_d > 0) {
						obj->to_d = -obj->to_d;
					}

					/* Sometimes, blast even items without bonuses. */
					if (!obj->to_d && !obj->to_h && one_in_(5)) {
						penalty = randint1(4) + 1;
						penalty *= 5;
						obj->to_h -= penalty;
						obj->to_d -= penalty;
					}
				}
			}
		}

		/* Make any bonuses negative, or strip all bonuses, and add a random
		 * stat or three with large negative bonuses. */
		if (wheel_of_doom == 3) {
			if (!one_in_(3)) {
				for (j = 0; j < STAT_MAX; j++) {
					int16_t *bonus = art ? &art->modifiers[j] : &obj->modifiers[j];
					if ((*bonus) > 0) {
						*bonus = -(*bonus);
					}
				}

				/* Artifact is highly unlikely to have any value. */
				if (art) {
					art->cost = MAX(art->cost - 30000L, 0);
				}
			} else {
				/* Iron Crown of Beruthiel, here we come... */
				penalty = -(randint1(5)) - 3;
				if (one_in_(3)) {
					penalty *= 5;
				}
				for (j = 0; j < OBJ_MOD_MAX; j++) {
					int16_t *bonus = art ? &art->modifiers[j] : &obj->modifiers[j];
					*bonus = 0;
				}
				if (one_in_(5)) {
					for (j = 0; j < STAT_MAX; j++) {
						int16_t *bonus = art ? &art->modifiers[j] :
							&obj->modifiers[j];
						if (j == OBJ_MOD_STR) *bonus = penalty;
						if (j == OBJ_MOD_DEX) *bonus = penalty;
						if (j == OBJ_MOD_CON) *bonus = penalty;
					}
				} else if (one_in_(4)) {
					for (j = 0; j < STAT_MAX; j++) {
						int16_t *bonus = art ? &art->modifiers[j] :
							&obj->modifiers[j];
						if (j == OBJ_MOD_WIS) *bonus = penalty;
						if (j == OBJ_MOD_INT) *bonus = penalty;
					}
				} else if (one_in_(6)) {
					int16_t *bonus = art ? &art->modifiers[OBJ_MOD_SPEED] :
						&obj->modifiers[OBJ_MOD_SPEED];
					*bonus = penalty;
				} else {
					for (j = 0; j < STAT_MAX; j++) {
						int16_t *bonus = art ? &art->modifiers[j] :
							&obj->modifiers[j];
						if (one_in_(4)) {
							*bonus = penalty;
						}
					}
				}

				/* More curses for good measure... */
				num_curses += randint1(2);

				/* Artifact is highly unlikely to have any value. */
				if (art) {
					art->cost = MAX(art->cost - 60000L, 0);
				}
			}
		}

		/* Strip lots of other qualities. */
		if (wheel_of_doom == 4) {
			bitflag *flags = art ? art->flags : obj->flags;

			/* Powerful modifiers */
			if (art) {
				art->modifiers[OBJ_MOD_BLOWS] = 0;
			} else {
				obj->modifiers[OBJ_MOD_BLOWS] = 0;
			}
			if (one_in_(4)) {
				if (art) {
					art->modifiers[OBJ_MOD_SHOTS] = 0;
				} else {
					obj->modifiers[OBJ_MOD_SHOTS] = 0;
				}
			}
			if (one_in_(4)) {
				if (art) {
					art->modifiers[OBJ_MOD_MIGHT] = 0;
				} else {
					obj->modifiers[OBJ_MOD_MIGHT] = 0;
				}
			}

			/* Slays */
			for (i = 0; i < z_info->slay_max; i++) {
				bool *slay = NULL;
				if (art && art->slays) slay = &art->slays[i];
				if (obj && obj->slays) slay = &obj->slays[i];
				if (one_in_(3) && slay) *slay = false;
			}
			for (i = 0; i < z_info->slay_max; i++) {
				if (art && art->slays && art->slays[i]) break;
				if (obj && obj->slays && obj->slays[i]) break;
			}
			if (art && (i == z_info->slay_max)) {
				mem_free(art->slays);
				art->slays = NULL;
			} else if (obj && (i == z_info->slay_max)) {
				mem_free(obj->slays);
				obj->slays = NULL;
			}
			if (one_in_(3)) {
				of_off(flags, OF_PERFECT_BALANCE);
			}

			/* Brands */
			for (i = 0; i < z_info->brand_max; i++) {
				bool *brand = NULL;
				if (art && art->brands) brand = &art->brands[i];
				if (obj && obj->brands) brand = &obj->brands[i];
				if (one_in_(3) && brand) *brand = false;
			}
			for (i = 0; i < z_info->brand_max; i++) {
				if (art && art->brands && art->brands[i]) break;
				if (obj && obj->brands && obj->brands[i]) break;
			}
			if (art && (i == z_info->brand_max)) {
				mem_free(art->brands);
				art->brands = NULL;
			} else if (obj && (i == z_info->brand_max)) {
				mem_free(obj->brands);
				obj->brands = NULL;
			}

			/* Resists */
			for (i = 0; i < ELEM_HIGH_MAX; i++) {
				int16_t *level = art ? &art->el_info[i].res_level :
					&obj->el_info[i].res_level;
				if (one_in_(3) && (*level < RES_LEVEL_BASE)) {
					*level += 2 * (RES_LEVEL_BASE - *level);
				}
			}

			/* Flags */
			for (i = 0; i < z_info->property_max; i++) {
				struct obj_property *prop = &obj_properties[i];
				if (one_in_(3) && (prop->type == OBJ_PROPERTY_FLAG) &&
					(prop->subtype == OFT_PROT || prop->subtype == OFT_MISC)) {
					of_off(flags, prop->index);
				}
			}

			/* Artifact will still have some value. */
			if (art && art->cost > 0) {
				art->cost /= 3L;
			}
		}
	}

	/* Boundary control. */
	if (art && art->cost < 0) {
		art->cost = 0;
	}

	/* Apply curses. */
	while (num_curses) {
		int level = art ? art->alloc_min : obj->kind->alloc_min;
		int tval = art ? art->tval : obj->tval;
		int pick = randint1(z_info->curse_max - 1);
		int power = randint1(9) + 10 * m_bonus(9, level);
		if (!curses[pick].poss[tval]) {
			continue;
		}
		if (art) {
			append_artifact_curse(art, pick, power);
		} else {
			append_object_curse(obj, pick, power);
		}
		num_curses--;
	}
}